

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O1

void tx_block_yrd(AV1_COMP *cpi,MACROBLOCK *x,int blk_row,int blk_col,int block,TX_SIZE tx_size,
                 BLOCK_SIZE plane_bsize,int depth,ENTROPY_CONTEXT *above_ctx,
                 ENTROPY_CONTEXT *left_ctx,TXFM_CONTEXT *tx_above,TXFM_CONTEXT *tx_left,
                 int64_t ref_best_rd,RD_STATS *rd_stats,FAST_TX_SEARCH_MODE ftxs_mode)

{
  uint8_t *puVar1;
  TX_SIZE TVar2;
  BLOCK_SIZE BVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  uint __c;
  uint uVar11;
  int iVar12;
  TX_SIZE TVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  byte bVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  FAST_TX_SEARCH_MODE in_stack_ffffffffffffff08;
  long local_98;
  RD_STATS pn_rd_stats;
  TXB_CTX txb_ctx;
  
  uVar9 = (ulong)plane_bsize;
  uVar11 = (uint)block_size_high[uVar9];
  iVar12 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar12 < 0) {
    uVar11 = (uint)block_size_high[uVar9] +
             (iVar12 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar14 = (uint)block_size_wide[uVar9];
  iVar12 = (x->e_mbd).mb_to_right_edge;
  if (iVar12 < 0) {
    uVar14 = (uint)block_size_wide[uVar9] +
             (iVar12 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
  }
  iVar12 = ((int)uVar11 >> 2) - blk_row;
  if (iVar12 == 0 || (int)uVar11 >> 2 < blk_row) {
    return;
  }
  iVar15 = ((int)uVar14 >> 2) - blk_col;
  if (iVar15 == 0 || (int)uVar14 >> 2 < blk_col) {
    return;
  }
  lVar24 = (long)blk_col;
  lVar23 = (long)blk_row;
  uVar22 = (ulong)tx_size;
  uVar11 = (uint)*(byte *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
  uVar14 = (uint)*(byte *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
  pMVar6 = *(x->e_mbd).mi;
  TVar2 = pMVar6->inter_tx_size
          [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar9] & 0x1f)) +
           ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar9] & 0x1f)) <<
           (av1_get_txb_size_index_stride_log2_table[uVar9] & 0x1f))];
  if (tx_size == '\0') {
    local_98 = 0;
    goto LAB_0024809a;
  }
  BVar3 = pMVar6->bsize;
  bVar17 = block_size_high[BVar3];
  if (block_size_high[BVar3] < block_size_wide[BVar3]) {
    bVar17 = block_size_wide[BVar3];
  }
  bVar20 = 1;
  if (bVar17 < 0x20) {
    if (bVar17 == 8) {
      TVar13 = '\x01';
      bVar7 = false;
      bVar20 = 0;
    }
    else {
      if (bVar17 != 0x10) goto LAB_00248054;
      TVar13 = '\x02';
LAB_00248046:
      bVar7 = false;
    }
  }
  else {
    TVar13 = '\x04';
    bVar7 = false;
    if ((bVar17 != 0x80) && (bVar7 = false, bVar17 != 0x40)) {
      if (bVar17 == 0x20) {
        TVar13 = '\x03';
        goto LAB_00248046;
      }
LAB_00248054:
      bVar7 = true;
      TVar13 = '\0';
      bVar20 = 1;
    }
  }
  local_98 = 0x3f;
  if (!bVar7) {
    local_98 = (ulong)(byte)((bVar20 & ""[uVar22] != TVar13) + TVar13 * -2 + 8) * 3;
  }
  local_98 = (ulong)(tx_left[lVar23] < uVar14) + (ulong)(tx_above[lVar24] < uVar11) + local_98;
LAB_0024809a:
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  if (TVar2 == tx_size) {
    bVar17 = ""[uVar22];
    bVar20 = ""[uVar22];
    get_txb_ctx(plane_bsize,tx_size,0,above_ctx + lVar24,left_ctx + lVar23,&txb_ctx);
    iVar12 = (x->coeff_costs).coeff_costs[(uint)bVar17 + (uint)bVar20 + 1 >> 1 & 0xff][0].
             txb_skip_cost[txb_ctx.txb_skip_ctx][1];
    rd_stats->zero_rate = iVar12;
    search_tx_type(cpi,x,0,block,blk_row,blk_col,plane_bsize,tx_size,&txb_ctx,'\0',0,ref_best_rd,
                   &pn_rd_stats);
    if (((long)rd_stats->rate == 0x7fffffff) || ((long)pn_rd_stats.rate == 0x7fffffff)) {
      rd_stats->rate = 0x7fffffff;
      rd_stats->zero_rate = 0;
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      rd_stats->skip_txfm = '\0';
    }
    else {
      lVar16 = (long)pn_rd_stats.rate + (long)rd_stats->rate;
      if (0x7ffffffe < lVar16) {
        lVar16 = 0x7fffffff;
      }
      rd_stats->rate = (int)lVar16;
      if (rd_stats->zero_rate == 0) {
        rd_stats->zero_rate = pn_rd_stats.zero_rate;
      }
      rd_stats->dist = rd_stats->dist + pn_rd_stats.dist;
      if ((rd_stats->sse != 0x7fffffffffffffff) && (pn_rd_stats.sse != 0x7fffffffffffffff)) {
        rd_stats->sse = pn_rd_stats.sse + rd_stats->sse;
      }
      rd_stats->skip_txfm = rd_stats->skip_txfm & pn_rd_stats.skip_txfm;
    }
    bVar17 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar9];
    if ((rd_stats->dist * 0x80 + ((long)rd_stats->rate * (long)x->rdmult + 0x100 >> 9) <
         rd_stats->sse * 0x80 + ((long)iVar12 * (long)x->rdmult + 0x100 >> 9)) &&
       (rd_stats->skip_txfm != '\x01')) {
      rd_stats->skip_txfm = '\0';
      puVar1 = (x->txfm_search_info).blk_skip + (int)((uint)bVar17 * blk_row + blk_col);
      *puVar1 = *puVar1 & 0xfe;
    }
    else {
      rd_stats->rate = iVar12;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = '\x01';
      puVar1 = (x->txfm_search_info).blk_skip + (int)((uint)bVar17 * blk_row + blk_col);
      *puVar1 = *puVar1 | 1;
      x->plane[0].eobs[block] = 0;
      x->plane[0].txb_entropy_ctx[block] = '\0';
      iVar12 = (x->e_mbd).tx_type_map_stride;
      (x->e_mbd).tx_type_map[blk_row * iVar12 + blk_col] = '\0';
      iVar15 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      iVar5 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      if (((0x41010UL >> (uVar22 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar22 & 0x3f) & 1) != 0)) {
        lVar16 = iVar12 * lVar23 + lVar24;
        lVar18 = 0;
        do {
          lVar19 = 0;
          do {
            (x->e_mbd).tx_type_map[lVar19 + lVar16] = '\0';
            lVar19 = lVar19 + 4;
          } while (lVar19 < iVar15);
          lVar18 = lVar18 + 4;
          lVar16 = lVar16 + (long)iVar12 * 4;
        } while (lVar18 < iVar5);
      }
    }
    if (depth < 2 && tx_size != '\0') {
      rd_stats->rate = rd_stats->rate + (x->mode_costs).txfm_partition_cost[local_98][0];
    }
    __c = (uint)x->plane[0].txb_entropy_ctx[block];
    memset(above_ctx + lVar24,__c,
           (long)*(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4)));
    memset(left_ctx + lVar23,__c,
           (long)*(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4)));
    bVar17 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar22]];
    memset(tx_left + lVar23,uVar14,
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar22]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar22]] == 0) & 0xff));
    memset(tx_above + lVar24,uVar11,(ulong)((uint)bVar17 + (uint)(bVar17 == 0) & 0xff));
  }
  else {
    iVar5 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    if (iVar5 < iVar12) {
      iVar12 = iVar5;
    }
    iVar5 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    if (iVar5 < iVar15) {
      iVar15 = iVar5;
    }
    bVar7 = 0 < iVar12;
    if (0 < iVar12) {
      bVar17 = ""[uVar22];
      iVar5 = tx_size_wide_unit[bVar17];
      iVar4 = tx_size_high_unit[bVar17];
      iVar10 = 0;
      lVar23 = 0;
      do {
        bVar8 = 0 < iVar15;
        if (0 < iVar15) {
          iVar21 = 0;
          do {
            pn_rd_stats.rate = 0;
            pn_rd_stats.dist = 0;
            pn_rd_stats.rdcost = 0;
            pn_rd_stats.sse = 0;
            pn_rd_stats.skip_txfm = '\x01';
            pn_rd_stats.zero_rate = 0;
            tx_block_yrd(cpi,x,blk_row + iVar10,blk_col + iVar21,block,bVar17,plane_bsize,depth + 1,
                         above_ctx,left_ctx,tx_above,tx_left,ref_best_rd - lVar23,&pn_rd_stats,
                         in_stack_ffffffffffffff08);
            lVar24 = (long)pn_rd_stats.rate;
            if (lVar24 == 0x7fffffff) {
              rd_stats->rate = 0x7fffffff;
              rd_stats->zero_rate = 0;
              rd_stats->dist = 0x7fffffffffffffff;
              rd_stats->rdcost = 0x7fffffffffffffff;
              rd_stats->sse = 0x7fffffffffffffff;
              rd_stats->skip_txfm = '\0';
            }
            else {
              if ((long)rd_stats->rate == 0x7fffffff) {
                rd_stats->rate = 0x7fffffff;
                rd_stats->zero_rate = 0;
                rd_stats->dist = 0x7fffffffffffffff;
                rd_stats->rdcost = 0x7fffffffffffffff;
                rd_stats->sse = 0x7fffffffffffffff;
                rd_stats->skip_txfm = '\0';
              }
              else {
                lVar16 = rd_stats->rate + lVar24;
                if (0x7ffffffe < lVar16) {
                  lVar16 = 0x7fffffff;
                }
                rd_stats->rate = (int)lVar16;
                if (rd_stats->zero_rate == 0) {
                  rd_stats->zero_rate = pn_rd_stats.zero_rate;
                }
                rd_stats->dist = rd_stats->dist + pn_rd_stats.dist;
                if ((rd_stats->sse != 0x7fffffffffffffff) && (pn_rd_stats.sse != 0x7fffffffffffffff)
                   ) {
                  rd_stats->sse = pn_rd_stats.sse + rd_stats->sse;
                }
                rd_stats->skip_txfm = rd_stats->skip_txfm & pn_rd_stats.skip_txfm;
              }
              lVar23 = pn_rd_stats.dist * 0x80 + lVar23 + (x->rdmult * lVar24 + 0x100 >> 9);
              block = block + iVar4 * iVar5;
            }
            if (pn_rd_stats.rate == 0x7fffffff) break;
            iVar21 = iVar21 + iVar5;
            bVar8 = iVar21 < iVar15;
          } while (iVar21 < iVar15);
        }
        if (bVar8) {
          if (bVar7) {
            return;
          }
          break;
        }
        iVar10 = iVar10 + iVar4;
        bVar7 = iVar10 < iVar12;
      } while (iVar10 < iVar12);
    }
    if (depth < 2 && tx_size != '\0') {
      rd_stats->rate = rd_stats->rate + (x->mode_costs).txfm_partition_cost[local_98][1];
    }
  }
  return;
}

Assistant:

static inline void tx_block_yrd(const AV1_COMP *cpi, MACROBLOCK *x, int blk_row,
                                int blk_col, int block, TX_SIZE tx_size,
                                BLOCK_SIZE plane_bsize, int depth,
                                ENTROPY_CONTEXT *above_ctx,
                                ENTROPY_CONTEXT *left_ctx,
                                TXFM_CONTEXT *tx_above, TXFM_CONTEXT *tx_left,
                                int64_t ref_best_rd, RD_STATS *rd_stats,
                                FAST_TX_SEARCH_MODE ftxs_mode) {
  assert(tx_size < TX_SIZES_ALL);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(is_inter_block(mbmi));
  const int max_blocks_high = max_block_high(xd, plane_bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, 0);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[av1_get_txb_size_index(
      plane_bsize, blk_row, blk_col)];
  const int ctx = txfm_partition_context(tx_above + blk_col, tx_left + blk_row,
                                         mbmi->bsize, tx_size);

  av1_init_rd_stats(rd_stats);
  if (tx_size == plane_tx_size) {
    ENTROPY_CONTEXT *ta = above_ctx + blk_col;
    ENTROPY_CONTEXT *tl = left_ctx + blk_row;
    const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, 0, ta, tl, &txb_ctx);

    const int zero_blk_rate =
        x->coeff_costs.coeff_costs[txs_ctx][get_plane_type(0)]
            .txb_skip_cost[txb_ctx.txb_skip_ctx][1];
    rd_stats->zero_rate = zero_blk_rate;
    tx_type_rd(cpi, x, tx_size, blk_row, blk_col, block, plane_bsize, &txb_ctx,
               rd_stats, ftxs_mode, ref_best_rd);
    const int mi_width = mi_size_wide[plane_bsize];
    TxfmSearchInfo *txfm_info = &x->txfm_search_info;
    if (RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist) >=
            RDCOST(x->rdmult, zero_blk_rate, rd_stats->sse) ||
        rd_stats->skip_txfm == 1) {
      rd_stats->rate = zero_blk_rate;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
      set_blk_skip(txfm_info->blk_skip, 0, blk_row * mi_width + blk_col, 1);
      x->plane[0].eobs[block] = 0;
      x->plane[0].txb_entropy_ctx[block] = 0;
      update_txk_array(xd, blk_row, blk_col, tx_size, DCT_DCT);
    } else {
      rd_stats->skip_txfm = 0;
      set_blk_skip(txfm_info->blk_skip, 0, blk_row * mi_width + blk_col, 0);
    }
    if (tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH)
      rd_stats->rate += x->mode_costs.txfm_partition_cost[ctx][0];
    av1_set_txb_context(x, 0, block, tx_size, ta, tl);
    txfm_partition_update(tx_above + blk_col, tx_left + blk_row, tx_size,
                          tx_size);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int txb_width = tx_size_wide_unit[sub_txs];
    const int txb_height = tx_size_high_unit[sub_txs];
    const int step = txb_height * txb_width;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    RD_STATS pn_rd_stats;
    int64_t this_rd = 0;
    assert(txb_width > 0 && txb_height > 0);

    for (int row = 0; row < row_end; row += txb_height) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += txb_width) {
        const int offsetc = blk_col + col;

        av1_init_rd_stats(&pn_rd_stats);
        tx_block_yrd(cpi, x, offsetr, offsetc, block, sub_txs, plane_bsize,
                     depth + 1, above_ctx, left_ctx, tx_above, tx_left,
                     ref_best_rd - this_rd, &pn_rd_stats, ftxs_mode);
        if (pn_rd_stats.rate == INT_MAX) {
          av1_invalid_rd_stats(rd_stats);
          return;
        }
        av1_merge_rd_stats(rd_stats, &pn_rd_stats);
        this_rd += RDCOST(x->rdmult, pn_rd_stats.rate, pn_rd_stats.dist);
        block += step;
      }
    }

    if (tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH)
      rd_stats->rate += x->mode_costs.txfm_partition_cost[ctx][1];
  }
}